

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O0

void __thiscall gl4cts::TextureViewTestCoherency::initTextures(TextureViewTestCoherency *this)

{
  int iVar1;
  deUint32 dVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  Functions *gl;
  TextureViewTestCoherency *this_local;
  long lVar4;
  
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar4 + 0x6f8))(1,&this->m_static_to_id);
  (**(code **)(lVar4 + 0x6f8))(1,&this->m_to_id);
  (**(code **)(lVar4 + 0x6f8))(1,&this->m_view_to_id);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glGenTextures() call(s) failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x23bd);
  (**(code **)(lVar4 + 0xb8))(0xde1,this->m_to_id);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glBindTexture() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x23c1);
  (**(code **)(lVar4 + 0x1380))
            (0xde1,this->m_texture_n_levels,0x8058,this->m_texture_width,this->m_texture_height);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glTexStorage2D() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x23c4);
  (**(code **)(lVar4 + 0x1360))(0xde1,0x2802,0x812f);
  (**(code **)(lVar4 + 0x1360))(0xde1,0x2803,0x812f);
  (**(code **)(lVar4 + 0x1360))(0xde1,0x2800,0x2600);
  (**(code **)(lVar4 + 0x1360))(0xde1,0x2801,0x2700);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glTexParameteri() call(s) failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x23ca);
  (**(code **)(lVar4 + 0x14b0))(this->m_view_to_id,0xde1,this->m_to_id,0x8058,1,2,0,1);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glTextureView() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x23d1);
  (**(code **)(lVar4 + 0xb8))(0xde1,this->m_view_to_id);
  (**(code **)(lVar4 + 0x1360))(0xde1,0x2802,0x812f);
  (**(code **)(lVar4 + 0x1360))(0xde1,0x2803,0x812f);
  (**(code **)(lVar4 + 0x1360))(0xde1,0x2800,0x2600);
  (**(code **)(lVar4 + 0x1360))(0xde1,0x2801,0x2700);
  (**(code **)(lVar4 + 0xb8))(0xde1,this->m_static_to_id);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glBindTexture() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x23db);
  (**(code **)(lVar4 + 0x1380))
            (0xde1,1,0x8058,this->m_static_texture_width,this->m_static_texture_height);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glTexStorage2D() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                  ,0x23df);
  initTextureContents(this);
  return;
}

Assistant:

void TextureViewTestCoherency::initTextures()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Generate the texture objects */
	gl.genTextures(1, &m_static_to_id);
	gl.genTextures(1, &m_to_id);
	gl.genTextures(1, &m_view_to_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures() call(s) failed.");

	/* Set up parent texture object */
	gl.bindTexture(GL_TEXTURE_2D, m_to_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture() call failed.");

	gl.texStorage2D(GL_TEXTURE_2D, m_texture_n_levels, GL_RGBA8, m_texture_width, m_texture_height);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexStorage2D() call failed.");

	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST_MIPMAP_NEAREST);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexParameteri() call(s) failed.");

	/* Set up the texture views we'll be using for the test */
	gl.textureView(m_view_to_id, GL_TEXTURE_2D, m_to_id, GL_RGBA8, 1, /* minlevel */
				   2,												  /* numlevels */
				   0,												  /* minlayer */
				   1);												  /* numlayers */
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTextureView() call failed");

	gl.bindTexture(GL_TEXTURE_2D, m_view_to_id);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST_MIPMAP_NEAREST);

	/* Set up storage for static color texture */
	gl.bindTexture(GL_TEXTURE_2D, m_static_to_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture() call failed.");

	gl.texStorage2D(GL_TEXTURE_2D, 1, /* levels */
					GL_RGBA8, m_static_texture_width, m_static_texture_height);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexStorage2D() call failed.");

	/* Fill the texture objects with actual contents */
	initTextureContents();
}